

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O3

bool __thiscall
sf::priv::CursorImpl::loadFromPixelsARGB
          (CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  long lVar1;
  long lVar2;
  Cursor CVar3;
  ulong uVar4;
  uint uVar5;
  
  lVar2 = XcursorImageCreate((ulong)size & 0xffffffff,(ulong)size >> 0x20);
  *(Vector2u *)(lVar2 + 0x10) = hotspot;
  uVar5 = size.y * size.x;
  if (uVar5 != 0) {
    lVar1 = *(long *)(lVar2 + 0x20);
    uVar4 = 0;
    do {
      *(uint *)(lVar1 + uVar4 * 4) =
           CONCAT13(pixels[uVar4 * 4 + 3],
                    CONCAT12(pixels[uVar4 * 4],
                             *(ushort *)(pixels + uVar4 * 4 + 1) << 8 |
                             *(ushort *)(pixels + uVar4 * 4 + 1) >> 8));
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  CVar3 = XcursorImageLoadCursor(this->m_display,lVar2);
  this->m_cursor = CVar3;
  XcursorImageDestroy(lVar2);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixelsARGB(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    // Create cursor image, convert from RGBA to ARGB.
    XcursorImage* cursorImage = XcursorImageCreate(static_cast<int>(size.x), static_cast<int>(size.y));
    cursorImage->xhot = hotspot.x;
    cursorImage->yhot = hotspot.y;

    const std::size_t numPixels = size.x * size.y;
    for (std::size_t pixelIndex = 0; pixelIndex < numPixels; ++pixelIndex)
    {
        cursorImage->pixels[pixelIndex] = static_cast<Uint32>(pixels[pixelIndex * 4 + 2] +
                                                              (pixels[pixelIndex * 4 + 1] << 8) +
                                                              (pixels[pixelIndex * 4 + 0] << 16) +
                                                              (pixels[pixelIndex * 4 + 3] << 24));
    }

    // Create the cursor.
    m_cursor = XcursorImageLoadCursor(m_display, cursorImage);

    // Free the resources
    XcursorImageDestroy(cursorImage);

    // We assume everything went fine...
    return true;
}